

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

int BZ2_bzDecompress(bz_stream *strm)

{
  Int32 *cftab;
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  DState *s;
  UInt16 *pUVar5;
  UInt32 *pUVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  Int32 IVar14;
  bz_stream *pbVar15;
  Int32 IVar16;
  UChar *pUVar17;
  int iVar18;
  UInt32 UVar19;
  uint uVar20;
  ulong uVar21;
  Int32 IVar22;
  long lVar23;
  UInt32 UVar24;
  UChar UVar25;
  
  if (((strm == (bz_stream *)0x0) || (s = (DState *)strm->state, s == (DState *)0x0)) ||
     (s->strm != strm)) {
    return -2;
  }
  cftab = s->cftab;
  IVar16 = s->state;
LAB_00188575:
  do {
    if (IVar16 == 1) {
      return -1;
    }
    if (IVar16 == 2) {
      if (s->smallDecompress == '\0') {
        if (s->blockRandomised == '\0') {
          UVar24 = s->calculatedBlockCRC;
          uVar12 = (uint)s->state_out_ch;
          IVar16 = s->state_out_len;
          pUVar6 = s->tt;
          uVar21 = (ulong)s->tPos;
          pUVar17 = (UChar *)s->strm->next_out;
          uVar7 = s->strm->avail_out;
          iVar18 = s->save_nblock;
          iVar13 = iVar18 + 1;
          uVar10 = s->blockSize100k * 100000;
          uVar11 = s->k0;
          uVar9 = uVar7;
          IVar14 = s->nblock_used;
LAB_00188fe5:
          UVar25 = (UChar)uVar12;
          UVar19 = (UInt32)uVar21;
          IVar22 = IVar14;
          if (IVar16 < 1) goto LAB_00189085;
          lVar23 = 0;
          while( true ) {
            uVar20 = (uint)lVar23;
            if (uVar9 == uVar20) {
              IVar16 = IVar16 - uVar20;
              pUVar17 = pUVar17 + lVar23;
              uVar9 = 0;
              goto LAB_001891ad;
            }
            if (IVar16 - 1U == uVar20) break;
            pUVar17[lVar23] = UVar25;
            UVar24 = UVar24 << 8 ^ BZ2_crc32Table[UVar24 >> 0x18 ^ uVar12 & 0xff];
            lVar23 = lVar23 + 1;
          }
          pUVar17 = pUVar17 + lVar23;
          uVar9 = uVar9 - uVar20;
LAB_0018905b:
          UVar25 = (UChar)uVar12;
          UVar19 = (UInt32)uVar21;
          if (uVar9 == 0) {
            uVar9 = 0;
            IVar16 = 1;
            goto LAB_001891ad;
          }
          *pUVar17 = UVar25;
          UVar24 = UVar24 << 8 ^ BZ2_crc32Table[uVar12 & 0xff ^ UVar24 >> 0x18];
          pUVar17 = pUVar17 + 1;
          uVar9 = uVar9 - 1;
          IVar22 = IVar14;
LAB_00189085:
          uVar12 = uVar11;
          UVar19 = (UInt32)uVar21;
          if (iVar13 < IVar22) {
            return -4;
          }
          if (IVar22 != iVar13) {
            if (uVar10 <= UVar19) {
              return -4;
            }
            uVar11 = pUVar6[uVar21] & 0xff;
            uVar20 = pUVar6[uVar21] >> 8;
            uVar21 = (ulong)uVar20;
            IVar14 = IVar22 + 1;
            if ((uVar11 != uVar12) || (uVar11 = uVar12, IVar22 == iVar18)) goto LAB_0018905b;
            if (uVar10 <= uVar20) {
              return -4;
            }
            puVar1 = pUVar6 + uVar21;
            uVar20 = *puVar1 >> 8;
            uVar21 = (ulong)uVar20;
            IVar16 = 2;
            IVar14 = iVar13;
            if ((IVar22 + 2 != iVar13) &&
               (uVar11 = *puVar1 & 0xff, IVar14 = IVar22 + 2, uVar11 == uVar12)) {
              if (uVar10 <= uVar20) {
                return -4;
              }
              puVar1 = pUVar6 + uVar21;
              uVar20 = *puVar1 >> 8;
              uVar21 = (ulong)uVar20;
              IVar16 = 3;
              uVar11 = uVar12;
              IVar14 = iVar13;
              if ((IVar22 + 3 != iVar13) &&
                 (uVar11 = *puVar1 & 0xff, IVar14 = IVar22 + 3, uVar11 == uVar12)) {
                if (uVar10 <= uVar20) {
                  return -4;
                }
                uVar20 = pUVar6[uVar21] >> 8;
                if (uVar10 <= uVar20) {
                  return -4;
                }
                IVar16 = (pUVar6[uVar21] & 0xff) + 4;
                uVar11 = pUVar6[uVar20] & 0xff;
                uVar21 = (ulong)(pUVar6[uVar20] >> 8);
                IVar14 = IVar22 + 5;
              }
            }
            goto LAB_00188fe5;
          }
          IVar16 = 0;
          uVar11 = uVar12;
          IVar14 = iVar13;
LAB_001891ad:
          pbVar15 = s->strm;
          uVar7 = uVar7 - uVar9;
          puVar1 = &pbVar15->total_out_lo32;
          uVar10 = *puVar1;
          *puVar1 = *puVar1 + uVar7;
          if (CARRY4(uVar10,uVar7)) {
            pbVar15->total_out_hi32 = pbVar15->total_out_hi32 + 1;
          }
          s->calculatedBlockCRC = UVar24;
          s->state_out_ch = UVar25;
          s->state_out_len = IVar16;
          s->nblock_used = IVar14;
          s->k0 = uVar11;
          s->tt = pUVar6;
          s->tPos = UVar19;
          pbVar15->next_out = (char *)pUVar17;
          pbVar15->avail_out = uVar9;
        }
        else {
          pbVar15 = s->strm;
          while( true ) {
            uVar7 = pbVar15->avail_out;
            while( true ) {
              if (uVar7 == 0) goto LAB_001891ed;
              if (s->state_out_len == 0) break;
              bVar2 = s->state_out_ch;
              *pbVar15->next_out = bVar2;
              s->calculatedBlockCRC =
                   s->calculatedBlockCRC << 8 ^
                   BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)bVar2];
              s->state_out_len = s->state_out_len + -1;
              pbVar15 = s->strm;
              pbVar15->next_out = pbVar15->next_out + 1;
              uVar7 = pbVar15->avail_out - 1;
              pbVar15->avail_out = uVar7;
              puVar1 = &pbVar15->total_out_lo32;
              *puVar1 = *puVar1 + 1;
              if (*puVar1 == 0) {
                pbVar15->total_out_hi32 = pbVar15->total_out_hi32 + 1;
              }
            }
            iVar13 = s->nblock_used;
            iVar8 = s->save_nblock;
            iVar18 = iVar8 + 1;
            if (iVar13 == iVar18) break;
            if (iVar13 != iVar18 && iVar18 <= iVar13) {
              return -4;
            }
            s->state_out_len = 1;
            uVar7 = s->k0;
            s->state_out_ch = (UChar)uVar7;
            uVar11 = s->blockSize100k * 100000;
            if (uVar11 <= s->tPos) {
              return -4;
            }
            pUVar6 = s->tt;
            uVar9 = pUVar6[s->tPos];
            uVar10 = uVar9 >> 8;
            s->tPos = uVar10;
            iVar18 = s->rNToGo;
            if (iVar18 == 0) {
              iVar18 = BZ2_rNums[s->rTPos];
              IVar16 = s->rTPos + 1;
              if (IVar16 == 0x200) {
                IVar16 = 0;
              }
              s->rTPos = IVar16;
            }
            IVar16 = iVar18 + -1;
            s->rNToGo = IVar16;
            s->nblock_used = iVar13 + 1;
            if (iVar13 != iVar8) {
              uVar9 = uVar9 & 0xff ^ (uint)(IVar16 == 1);
              if (uVar9 == uVar7) {
                s->state_out_len = 2;
                if (uVar11 <= uVar10) {
                  return -4;
                }
                uVar9 = pUVar6[uVar10];
                uVar10 = uVar9 >> 8;
                s->tPos = uVar10;
                if (IVar16 == 0) {
                  IVar16 = BZ2_rNums[s->rTPos];
                  IVar14 = s->rTPos + 1;
                  if (IVar14 == 0x200) {
                    IVar14 = 0;
                  }
                  s->rTPos = IVar14;
                }
                IVar16 = IVar16 + -1;
                s->rNToGo = IVar16;
                s->nblock_used = iVar13 + 2;
                if (iVar13 + 1 != iVar8) {
                  uVar9 = uVar9 & 0xff ^ (uint)(IVar16 == 1);
                  if (uVar9 == uVar7) {
                    s->state_out_len = 3;
                    if (uVar11 <= uVar10) {
                      return -4;
                    }
                    uVar9 = pUVar6[uVar10];
                    uVar10 = uVar9 >> 8;
                    s->tPos = uVar10;
                    if (IVar16 == 0) {
                      IVar16 = BZ2_rNums[s->rTPos];
                      IVar14 = s->rTPos + 1;
                      if (IVar14 == 0x200) {
                        IVar14 = 0;
                      }
                      s->rTPos = IVar14;
                    }
                    IVar16 = IVar16 + -1;
                    s->rNToGo = IVar16;
                    s->nblock_used = iVar13 + 3;
                    if (iVar13 + 2 != iVar8) {
                      uVar9 = uVar9 & 0xff ^ (uint)(IVar16 == 1);
                      if (uVar9 == uVar7) {
                        if (uVar11 <= uVar10) {
                          return -4;
                        }
                        uVar7 = pUVar6[uVar10];
                        uVar9 = uVar7 >> 8;
                        s->tPos = uVar9;
                        if (IVar16 == 0) {
                          IVar16 = BZ2_rNums[s->rTPos];
                          IVar14 = s->rTPos + 1;
                          if (IVar14 == 0x200) {
                            IVar14 = 0;
                          }
                          s->rTPos = IVar14;
                        }
                        IVar16 = IVar16 + -1;
                        s->rNToGo = IVar16;
                        s->nblock_used = iVar13 + 4;
                        s->state_out_len = (uVar7 & 0xff ^ (uint)(IVar16 == 1)) + 4;
                        if (uVar11 <= uVar9) {
                          return -4;
                        }
                        uVar7 = pUVar6[uVar9];
                        uVar11 = uVar7 & 0xff;
                        s->k0 = uVar11;
                        s->tPos = uVar7 >> 8;
                        if (IVar16 == 0) {
                          IVar16 = BZ2_rNums[s->rTPos];
                          IVar14 = s->rTPos + 1;
                          if (IVar14 == 0x200) {
                            IVar14 = 0;
                          }
                          s->rTPos = IVar14;
                        }
                        s->rNToGo = IVar16 + -1;
                        s->k0 = uVar11 ^ IVar16 + -1 == 1;
                        s->nblock_used = iVar13 + 5;
                      }
                      else {
                        s->k0 = uVar9;
                      }
                    }
                  }
                  else {
                    s->k0 = uVar9;
                  }
                }
              }
              else {
                s->k0 = uVar9;
              }
            }
          }
        }
      }
      else {
        pbVar15 = s->strm;
        if (s->blockRandomised != '\0') {
LAB_001885aa:
          do {
            uVar7 = pbVar15->avail_out;
            while( true ) {
              if (uVar7 == 0) goto LAB_001891ed;
              if (s->state_out_len == 0) break;
              bVar2 = s->state_out_ch;
              *pbVar15->next_out = bVar2;
              s->calculatedBlockCRC =
                   s->calculatedBlockCRC << 8 ^
                   BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)bVar2];
              s->state_out_len = s->state_out_len + -1;
              pbVar15 = s->strm;
              pbVar15->next_out = pbVar15->next_out + 1;
              uVar7 = pbVar15->avail_out - 1;
              pbVar15->avail_out = uVar7;
              puVar1 = &pbVar15->total_out_lo32;
              *puVar1 = *puVar1 + 1;
              if (*puVar1 == 0) {
                pbVar15->total_out_hi32 = pbVar15->total_out_hi32 + 1;
              }
            }
            iVar18 = s->nblock_used;
            iVar13 = s->save_nblock;
            iVar8 = iVar13 + 1;
            if (iVar18 == iVar8) goto LAB_001891ed;
            if (iVar18 != iVar8 && iVar8 <= iVar18) {
              return -4;
            }
            s->state_out_len = 1;
            uVar7 = s->tPos;
            uVar11 = s->k0;
            s->state_out_ch = (UChar)uVar11;
            uVar9 = s->blockSize100k * 100000;
            if (uVar9 <= uVar7) {
              return -4;
            }
            uVar10 = BZ2_indexIntoF(uVar7,cftab);
            pUVar17 = s->ll4;
            pUVar5 = s->ll16;
            uVar3 = pUVar5[uVar7];
            uVar7 = (pUVar17[uVar7 >> 1] >> ((char)uVar7 * '\x04' & 4U) & 0xf) << 0x10 | (uint)uVar3
            ;
            s->tPos = uVar7;
            iVar8 = s->rNToGo;
            if (iVar8 == 0) {
              iVar8 = BZ2_rNums[s->rTPos];
              IVar16 = s->rTPos + 1;
              if (IVar16 == 0x200) {
                IVar16 = 0;
              }
              s->rTPos = IVar16;
            }
            IVar16 = iVar8 + -1;
            s->rNToGo = IVar16;
            s->nblock_used = iVar18 + 1;
          } while (iVar18 == iVar13);
          uVar10 = uVar10 & 0xff ^ (uint)(IVar16 == 1);
          if (uVar10 == uVar11) {
            s->state_out_len = 2;
            if (uVar9 <= uVar7) {
              return -4;
            }
            uVar10 = BZ2_indexIntoF(uVar7,cftab);
            uVar4 = pUVar5[uVar7];
            uVar7 = (pUVar17[uVar7 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) << 0x10 | (uint)uVar4;
            s->tPos = uVar7;
            if (IVar16 == 0) {
              IVar16 = BZ2_rNums[s->rTPos];
              IVar14 = s->rTPos + 1;
              if (IVar14 == 0x200) {
                IVar14 = 0;
              }
              s->rTPos = IVar14;
            }
            IVar16 = IVar16 + -1;
            s->rNToGo = IVar16;
            s->nblock_used = iVar18 + 2;
            if (iVar18 + 1 == iVar13) goto LAB_001885aa;
            uVar10 = uVar10 & 0xff ^ (uint)(IVar16 == 1);
            if (uVar10 == uVar11) {
              s->state_out_len = 3;
              if (uVar9 <= uVar7) {
                return -4;
              }
              uVar10 = BZ2_indexIntoF(uVar7,cftab);
              uVar3 = pUVar5[uVar7];
              uVar7 = (pUVar17[uVar7 >> 1] >> (((byte)uVar4 & 1) << 2) & 0xf) << 0x10 | (uint)uVar3;
              s->tPos = uVar7;
              if (IVar16 == 0) {
                IVar16 = BZ2_rNums[s->rTPos];
                IVar14 = s->rTPos + 1;
                if (IVar14 == 0x200) {
                  IVar14 = 0;
                }
                s->rTPos = IVar14;
              }
              IVar16 = IVar16 + -1;
              s->rNToGo = IVar16;
              s->nblock_used = iVar18 + 3;
              if (iVar18 + 2 == iVar13) goto LAB_001885aa;
              uVar10 = uVar10 & 0xff ^ (uint)(IVar16 == 1);
              if (uVar10 == uVar11) {
                if (uVar9 <= uVar7) {
                  return -4;
                }
                uVar11 = BZ2_indexIntoF(uVar7,cftab);
                uVar4 = pUVar5[uVar7];
                uVar7 = (pUVar17[uVar7 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) << 0x10 |
                        (uint)uVar4;
                s->tPos = uVar7;
                if (IVar16 == 0) {
                  IVar16 = BZ2_rNums[s->rTPos];
                  IVar14 = s->rTPos + 1;
                  if (IVar14 == 0x200) {
                    IVar14 = 0;
                  }
                  s->rTPos = IVar14;
                }
                IVar16 = IVar16 + -1;
                s->rNToGo = IVar16;
                s->nblock_used = iVar18 + 4;
                s->state_out_len = (uVar11 & 0xff ^ (uint)(IVar16 == 1)) + 4;
                if (uVar9 <= uVar7) {
                  return -4;
                }
                uVar11 = BZ2_indexIntoF(uVar7,cftab);
                s->k0 = uVar11;
                s->tPos = (pUVar17[uVar7 >> 1] >> (sbyte)(((ulong)uVar4 & 0x3fffffffffffffc1) << 2)
                          & 0xf) << 0x10 | (uint)pUVar5[uVar7];
                if (IVar16 == 0) {
                  IVar16 = BZ2_rNums[s->rTPos];
                  IVar14 = s->rTPos + 1;
                  if (IVar14 == 0x200) {
                    IVar14 = 0;
                  }
                  s->rTPos = IVar14;
                }
                s->rNToGo = IVar16 + -1;
                s->k0 = uVar11 ^ IVar16 + -1 == 1;
                s->nblock_used = iVar18 + 5;
                goto LAB_001885aa;
              }
            }
          }
          s->k0 = uVar10;
          goto LAB_001885aa;
        }
        uVar7 = pbVar15->avail_out;
LAB_00188cb6:
        if (uVar7 != 0) {
          if (s->state_out_len == 0) {
            iVar18 = s->nblock_used;
            iVar13 = s->save_nblock;
            iVar8 = iVar13 + 1;
            if (iVar18 == iVar8) goto LAB_001891ed;
            if (iVar18 != iVar8 && iVar8 <= iVar18) {
              return -4;
            }
            s->state_out_len = 1;
            uVar11 = s->tPos;
            uVar9 = s->k0;
            s->state_out_ch = (UChar)uVar9;
            uVar10 = s->blockSize100k * 100000;
            if (uVar10 <= uVar11) {
              return -4;
            }
            uVar12 = BZ2_indexIntoF(uVar11,cftab);
            pUVar5 = s->ll16;
            pUVar17 = s->ll4;
            uVar3 = pUVar5[uVar11];
            uVar11 = (pUVar17[uVar11 >> 1] >> ((char)uVar11 * '\x04' & 4U) & 0xf) << 0x10 |
                     (uint)uVar3;
            s->tPos = uVar11;
            s->nblock_used = iVar18 + 1;
            if (iVar18 != iVar13) {
              uVar20 = uVar12 & 0xff;
              if ((uVar12 & 0xff) == uVar9) {
                s->state_out_len = 2;
                if (uVar10 <= uVar11) {
                  return -4;
                }
                uVar12 = BZ2_indexIntoF(uVar11,cftab);
                uVar4 = pUVar5[uVar11];
                uVar11 = (pUVar17[uVar11 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) << 0x10 |
                         (uint)uVar4;
                s->tPos = uVar11;
                s->nblock_used = iVar18 + 2;
                if (iVar18 + 1 == iVar13) goto LAB_00188cb6;
                uVar20 = uVar12 & 0xff;
                if ((uVar12 & 0xff) == uVar9) {
                  s->state_out_len = 3;
                  if (uVar10 <= uVar11) {
                    return -4;
                  }
                  uVar12 = BZ2_indexIntoF(uVar11,cftab);
                  uVar3 = pUVar5[uVar11];
                  uVar11 = (pUVar17[uVar11 >> 1] >> (((byte)uVar4 & 1) << 2) & 0xf) << 0x10 |
                           (uint)uVar3;
                  s->tPos = uVar11;
                  s->nblock_used = iVar18 + 3;
                  if (iVar18 + 2 == iVar13) goto LAB_00188cb6;
                  uVar20 = uVar12 & 0xff;
                  if ((uVar12 & 0xff) == uVar9) {
                    if (uVar10 <= uVar11) {
                      return -4;
                    }
                    uVar9 = BZ2_indexIntoF(uVar11,cftab);
                    uVar4 = pUVar5[uVar11];
                    uVar11 = (pUVar17[uVar11 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) << 0x10 |
                             (uint)uVar4;
                    s->tPos = uVar11;
                    s->nblock_used = iVar18 + 4;
                    s->state_out_len = (uVar9 & 0xff) + 4;
                    if (uVar10 <= uVar11) {
                      return -4;
                    }
                    IVar16 = BZ2_indexIntoF(uVar11,cftab);
                    s->k0 = IVar16;
                    s->tPos = (pUVar17[uVar11 >> 1] >> (((byte)uVar4 & 1) << 2) & 0xf) << 0x10 |
                              (uint)pUVar5[uVar11];
                    s->nblock_used = iVar18 + 5;
                    goto LAB_00188cb6;
                  }
                }
              }
              s->k0 = uVar20;
            }
          }
          else {
            bVar2 = s->state_out_ch;
            *pbVar15->next_out = bVar2;
            s->calculatedBlockCRC =
                 s->calculatedBlockCRC << 8 ^
                 BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)bVar2];
            s->state_out_len = s->state_out_len + -1;
            pbVar15 = s->strm;
            pbVar15->next_out = pbVar15->next_out + 1;
            uVar7 = pbVar15->avail_out - 1;
            pbVar15->avail_out = uVar7;
            puVar1 = &pbVar15->total_out_lo32;
            *puVar1 = *puVar1 + 1;
            if (*puVar1 == 0) {
              pbVar15->total_out_hi32 = pbVar15->total_out_hi32 + 1;
            }
          }
          goto LAB_00188cb6;
        }
      }
LAB_001891ed:
      if (s->nblock_used != s->save_nblock + 1) {
        return 0;
      }
      if (s->state_out_len != 0) {
        return 0;
      }
      s->calculatedBlockCRC = ~s->calculatedBlockCRC;
      iVar18 = s->verbosity;
      if (2 < iVar18) {
        fprintf(_stderr," {0x%08x, 0x%08x}",(ulong)s->storedBlockCRC);
        iVar18 = s->verbosity;
      }
      if (1 < iVar18) {
        fputc(0x5d,_stderr);
      }
      if (s->calculatedBlockCRC != s->storedBlockCRC) {
        return -4;
      }
      s->calculatedCombinedCRC =
           (s->calculatedCombinedCRC << 1 | (uint)((int)s->calculatedCombinedCRC < 0)) ^
           s->calculatedBlockCRC;
      s->state = 0xe;
    }
    else if (IVar16 < 10) goto LAB_00188575;
    IVar14 = BZ2_decompress(s);
    if (IVar14 == 4) {
      if (2 < s->verbosity) {
        fprintf(_stderr,"\n    combined CRCs: stored = 0x%08x, computed = 0x%08x",
                (ulong)s->storedCombinedCRC,(ulong)s->calculatedCombinedCRC);
      }
      return (uint)(s->calculatedCombinedCRC == s->storedCombinedCRC) * 8 + -4;
    }
    IVar16 = 2;
    if (s->state != 2) {
      return IVar14;
    }
  } while( true );
}

Assistant:

int BZ_API(BZ2_bzDecompress) ( bz_stream *strm )
{
   Bool    corrupt;
   DState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   while (True) {
      if (s->state == BZ_X_IDLE) return BZ_SEQUENCE_ERROR;
      if (s->state == BZ_X_OUTPUT) {
         if (s->smallDecompress)
            corrupt = unRLE_obuf_to_output_SMALL ( s ); else
            corrupt = unRLE_obuf_to_output_FAST  ( s );
         if (corrupt) return BZ_DATA_ERROR;
         if (s->nblock_used == s->save_nblock+1 && s->state_out_len == 0) {
            BZ_FINALISE_CRC ( s->calculatedBlockCRC );
            if (s->verbosity >= 3) 
               VPrintf2 ( " {0x%08x, 0x%08x}", s->storedBlockCRC, 
                          s->calculatedBlockCRC );
            if (s->verbosity >= 2) VPrintf0 ( "]" );
            if (s->calculatedBlockCRC != s->storedBlockCRC)
               return BZ_DATA_ERROR;
            s->calculatedCombinedCRC 
               = (s->calculatedCombinedCRC << 1) | 
                    (s->calculatedCombinedCRC >> 31);
            s->calculatedCombinedCRC ^= s->calculatedBlockCRC;
            s->state = BZ_X_BLKHDR_1;
         } else {
            return BZ_OK;
         }
      }
      if (s->state >= BZ_X_MAGIC_1) {
         Int32 r = BZ2_decompress ( s );
         if (r == BZ_STREAM_END) {
            if (s->verbosity >= 3)
               VPrintf2 ( "\n    combined CRCs: stored = 0x%08x, computed = 0x%08x", 
                          s->storedCombinedCRC, s->calculatedCombinedCRC );
            if (s->calculatedCombinedCRC != s->storedCombinedCRC)
               return BZ_DATA_ERROR;
            return r;
         }
         if (s->state != BZ_X_OUTPUT) return r;
      }
   }

   AssertH ( 0, 6001 );

   return 0;  /*NOTREACHED*/
}